

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_key_derivation_input_internal
          (psa_key_derivation_operation_t *operation,psa_key_derivation_step_t step,
          psa_key_type_t key_type,uint8_t *data,size_t data_length)

{
  psa_hmac_internal_data *hmac;
  psa_algorithm_t hash_alg;
  int iVar1;
  uint uVar2;
  byte bVar3;
  uint8_t uVar4;
  uint uVar5;
  int iVar6;
  uint8_t *__dest;
  undefined6 in_register_00000032;
  uint8_t local_138;
  undefined1 local_137;
  undefined1 local_136 [262];
  
  uVar5 = operation->alg;
  uVar2 = uVar5 & 0x2003ffff;
  if ((uVar5 & 0x7f000000) != 0x30000000) {
    uVar2 = uVar5;
  }
  iVar1 = (int)CONCAT62(in_register_00000032,step);
  if (iVar1 - 0x201U < 4) {
    iVar6 = -0x87;
    if (key_type == 0) {
      iVar6 = 0;
    }
    if (key_type == 0x1001) {
      iVar6 = 0;
    }
  }
  else {
    iVar6 = -0x87;
    if (iVar1 == 0x101) {
      iVar6 = -0x87;
      if (key_type == 0) {
        iVar6 = 0;
      }
      if (key_type == 0x1200) {
        iVar6 = 0;
      }
    }
  }
  if (iVar6 != 0) goto LAB_00112273;
  uVar5 = uVar2 & 0xffffff00;
  if (uVar5 == 0x20000300) {
    uVar5 = uVar2 & 0xff | 0x1000000;
    if (step == 0x101) {
      iVar6 = -0x87;
      if (data_length < 0x81) {
        local_138 = '\0';
        local_137 = (undefined1)data_length;
        memset(local_136,0,data_length);
        local_136[data_length] = 0;
        local_136[data_length + 1] = local_137;
        memcpy(local_136 + data_length + 2,data,data_length);
        iVar6 = -0x89;
        if (((operation->ctx).tls12_prf.state == TLS12_PRF_STATE_SEED_SET) &&
           (iVar6 = psa_hmac_setup_internal
                              ((psa_hmac_internal_data *)
                               ((long)&(operation->ctx).hkdf.hmac.hash_ctx.ctx + 0x10),&local_138,
                               (size_t)(local_136 + data_length + 2 +
                                       (data_length - (long)&local_138)),uVar5), iVar6 == 0)) {
          (operation->ctx).tls12_prf.state = TLS12_PRF_STATE_KEY_SET;
          iVar6 = 0;
        }
        mbedtls_platform_zeroize(&local_138,0x104);
      }
      goto LAB_00112273;
    }
  }
  else {
    if (uVar5 != 0x20000200) {
      iVar6 = -0x89;
      if (uVar5 != 0x20000100) {
        return -0x89;
      }
      hash_alg = (uVar2 & 0xff) + 0x1000000;
      if (step == 0x101) {
        if (((operation->ctx).tls12_prf.output_block[0x2a] & 3) == 0) {
          iVar6 = psa_hmac_setup_internal(&(operation->ctx).hkdf.hmac,(uint8_t *)0x0,0,hash_alg);
          if (iVar6 != 0) goto LAB_00112273;
          (operation->ctx).tls12_prf.output_block[0x2a] =
               ((operation->ctx).tls12_prf.output_block[0x2a] & 0xfc) + 1;
        }
        iVar6 = -0x89;
        if (((operation->ctx).tls12_prf.output_block[0x2a] & 3) != 1) goto LAB_00112273;
        hmac = &(operation->ctx).hkdf.hmac;
        iVar6 = psa_hash_update(&hmac->hash_ctx,data,data_length);
        if ((iVar6 != 0) ||
           (iVar6 = psa_hmac_finish_internal(hmac,(operation->ctx).hkdf.prk,0x40), iVar6 != 0))
        goto LAB_00112273;
        bVar3 = (char)uVar2 - 1;
        if ((bVar3 < 0x12) && ((0x39f9fU >> (bVar3 & 0x1f) & 1) != 0)) {
          uVar4 = (&DAT_0013b445)[bVar3];
        }
        else {
          uVar4 = ((uVar2 & 0xff) == 0x13) << 6;
        }
        (operation->ctx).hkdf.offset_in_block = uVar4;
        (operation->ctx).hkdf.block_number = '\0';
        bVar3 = (operation->ctx).tls12_prf.output_block[0x2a] & 0xfc | 2;
LAB_001123c2:
        (operation->ctx).tls12_prf.output_block[0x2a] = bVar3;
      }
      else {
        if (step != 0x203) {
          iVar6 = -0x87;
          if (((step != 0x202) ||
              (iVar6 = -0x89, ((operation->ctx).tls12_prf.output_block[0x2a] & 3) != 0)) ||
             (iVar6 = psa_hmac_setup_internal(&(operation->ctx).hkdf.hmac,data,data_length,hash_alg)
             , iVar6 != 0)) goto LAB_00112273;
          bVar3 = ((operation->ctx).tls12_prf.output_block[0x2a] & 0xfc) + 1;
          goto LAB_001123c2;
        }
        bVar3 = (operation->ctx).tls12_prf.output_block[0x2a];
        if ((bVar3 & 4) != 0 || (~bVar3 & 3) == 0) goto LAB_00112273;
        (operation->ctx).hkdf.info_length = data_length;
        if (data_length != 0) {
          __dest = (uint8_t *)calloc(1,data_length);
          (operation->ctx).hkdf.info = __dest;
          if (__dest == (uint8_t *)0x0) {
            iVar6 = -0x8d;
            goto LAB_00112273;
          }
          memcpy(__dest,data,data_length);
        }
        (operation->ctx).tls12_prf.output_block[0x2a] = bVar3 | 4;
      }
      iVar6 = 0;
      goto LAB_00112273;
    }
    uVar5 = uVar2 & 0xff | 0x1000000;
  }
  iVar6 = psa_tls12_prf_input(&(operation->ctx).tls12_prf,uVar5,step,data,data_length);
LAB_00112273:
  if (iVar6 != 0) {
    psa_key_derivation_abort(operation);
  }
  return iVar6;
}

Assistant:

static psa_status_t psa_key_derivation_input_internal(
    psa_key_derivation_operation_t *operation,
    psa_key_derivation_step_t step,
    psa_key_type_t key_type,
    const uint8_t *data,
    size_t data_length )
{
    psa_status_t status;
    psa_algorithm_t kdf_alg = psa_key_derivation_get_kdf_alg( operation );

    status = psa_key_derivation_check_input_type( step, key_type );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HKDF( kdf_alg ) )
    {
        status = psa_hkdf_input( &operation->ctx.hkdf,
                                 PSA_ALG_HKDF_GET_HASH( kdf_alg ),
                                 step, data, data_length );
    }
    else if( PSA_ALG_IS_TLS12_PRF( kdf_alg ) )
    {
        status = psa_tls12_prf_input( &operation->ctx.tls12_prf,
                                      PSA_ALG_HKDF_GET_HASH( kdf_alg ),
                                      step, data, data_length );
    }
    else if( PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) )
    {
        status = psa_tls12_prf_psk_to_ms_input( &operation->ctx.tls12_prf,
                                                PSA_ALG_HKDF_GET_HASH( kdf_alg ),
                                                step, data, data_length );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        /* This can't happen unless the operation object was not initialized */
        return( PSA_ERROR_BAD_STATE );
    }

exit:
    if( status != PSA_SUCCESS )
        psa_key_derivation_abort( operation );
    return( status );
}